

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::processCommandInstruction(CommonCore *this,ActionMessage *command)

{
  GlobalFederateId sourceId;
  GlobalFederateId destId;
  string_view message;
  _Alloc_hider __src;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  string_view str;
  format_args args;
  string_view name;
  string warnString;
  ActionMessage warn;
  string local_128;
  size_t local_108;
  char *pcStack_100;
  pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_f8;
  ActionMessage local_d8;
  
  BrokerBase::processBaseCommands(&local_f8,&this->super_BrokerBase,command);
  if (local_f8.first == false) {
    local_d8._8_8_ =
         (local_f8.second.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_len;
    local_d8._0_8_ =
         (local_f8.second.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_str;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x25;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_d8;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_128,(v11 *)"Unrecognized command instruction \"{}\"",fmt,args);
    local_108 = local_128._M_string_length;
    pcStack_100 = local_128._M_dataplus._M_p;
    message._M_str = local_128._M_dataplus._M_p;
    message._M_len = local_128._M_string_length;
    name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    name._M_len = (this->super_BrokerBase).identifier._M_string_length;
    BrokerBase::sendToLogger
              (&this->super_BrokerBase,
               (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,name,message,
               false);
    sourceId.gid = (this->super_BrokerBase).global_broker_id_local.gid;
    destId.gid = (command->source_id).gid;
    if (destId.gid != sourceId.gid) {
      ActionMessage::ActionMessage(&local_d8,cmd_warning,sourceId,destId);
      __src._M_p = local_128._M_dataplus._M_p;
      if ((byte *)local_128._M_dataplus._M_p == local_d8.payload.heap) {
        local_d8.payload.bufferSize = local_128._M_string_length;
      }
      else {
        SmallBuffer::reserve(&local_d8.payload,local_128._M_string_length);
        local_d8.payload.bufferSize = local_128._M_string_length;
        if (local_128._M_string_length != 0) {
          memcpy(local_d8.payload.heap,__src._M_p,local_128._M_string_length);
        }
      }
      local_d8.messageID = 3;
      str._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      str._M_len = (this->super_BrokerBase).identifier._M_string_length;
      ActionMessage::setString(&local_d8,0,str);
      routeMessage(this,&local_d8);
      ActionMessage::~ActionMessage(&local_d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_f8.second.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.second.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.second.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.second.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CommonCore::processCommandInstruction(ActionMessage& command)
{
    auto [processed, res] = processBaseCommands(command);
    if (processed) {
        return;
    }
    auto warnString = fmt::format("Unrecognized command instruction \"{}\"", res[0]);
    LOG_WARNING(global_broker_id_local, getIdentifier(), warnString);
    if (command.source_id != global_broker_id_local) {
        ActionMessage warn(CMD_WARNING, global_broker_id_local, command.source_id);
        warn.payload = std::move(warnString);
        warn.messageID = HELICS_LOG_LEVEL_WARNING;
        warn.setString(0, getIdentifier());
        routeMessage(warn);
    }
}